

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O2

void duckdb::BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::ReplaceChild
               (BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *n,uint8_t byte,Node child)

{
  idx_t iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (n->count == uVar3) {
      return;
    }
    uVar2 = uVar3 + 1;
  } while (n->key[uVar3] != byte);
  iVar1 = n->children[uVar3].super_IndexPointer.data;
  n->children[uVar3].super_IndexPointer.data = (idx_t)child.super_IndexPointer.data;
  if ((ulong)child.super_IndexPointer.data >> 0x38 != 0 && (long)iVar1 < 0) {
    n->children[uVar3].super_IndexPointer.data =
         (ulong)child.super_IndexPointer.data | 0x8000000000000000;
  }
  return;
}

Assistant:

static void ReplaceChild(BaseNode &n, const uint8_t byte, const Node child) {
		D_ASSERT(n.count != 0);
		for (uint8_t i = 0; i < n.count; i++) {
			if (n.key[i] == byte) {
				auto status = n.children[i].GetGateStatus();
				n.children[i] = child;

				if (status == GateStatus::GATE_SET && child.HasMetadata()) {
					n.children[i].SetGateStatus(status);
				}
				return;
			}
		}
	}